

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O1

void av1_copy_tree_context(PICK_MODE_CONTEXT *dst_ctx,PICK_MODE_CONTEXT *src_ctx)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int iVar4;
  undefined7 uVar5;
  long lVar6;
  MB_MODE_INFO_EXT_FRAME *pMVar7;
  MB_MODE_INFO_EXT_FRAME *pMVar8;
  byte bVar9;
  
  bVar9 = 0;
  memcpy(dst_ctx,src_ctx,0xb0);
  pMVar7 = &src_ctx->mbmi_ext_best;
  pMVar8 = &dst_ctx->mbmi_ext_best;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pMVar8->ref_mv_stack[0] = pMVar7->ref_mv_stack[0];
    pMVar7 = (MB_MODE_INFO_EXT_FRAME *)((long)pMVar7 + (ulong)bVar9 * -0x10 + 8);
    pMVar8 = (MB_MODE_INFO_EXT_FRAME *)((long)pMVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  *(undefined4 *)((dst_ctx->mbmi_ext_best).cb_offset + 1) =
       *(undefined4 *)((src_ctx->mbmi_ext_best).cb_offset + 1);
  iVar4 = src_ctx->skippable;
  dst_ctx->num_4x4_blk = src_ctx->num_4x4_blk;
  dst_ctx->skippable = iVar4;
  memcpy(dst_ctx->blk_skip,src_ctx->blk_skip,(long)src_ctx->num_4x4_blk);
  memcpy(dst_ctx->tx_type_map,src_ctx->tx_type_map,(long)src_ctx->num_4x4_blk);
  iVar4 = (src_ctx->rd_stats).zero_rate;
  iVar1 = (src_ctx->rd_stats).dist;
  iVar2 = (src_ctx->rd_stats).rdcost;
  iVar3 = (src_ctx->rd_stats).sse;
  (dst_ctx->rd_stats).rate = (src_ctx->rd_stats).rate;
  (dst_ctx->rd_stats).zero_rate = iVar4;
  (dst_ctx->rd_stats).dist = iVar1;
  (dst_ctx->rd_stats).rdcost = iVar2;
  (dst_ctx->rd_stats).sse = iVar3;
  uVar5 = *(undefined7 *)&(src_ctx->rd_stats).field_0x21;
  (dst_ctx->rd_stats).skip_txfm = (src_ctx->rd_stats).skip_txfm;
  *(undefined7 *)&(dst_ctx->rd_stats).field_0x21 = uVar5;
  dst_ctx->rd_mode_is_ready = src_ctx->rd_mode_is_ready;
  return;
}

Assistant:

void av1_copy_tree_context(PICK_MODE_CONTEXT *dst_ctx,
                           PICK_MODE_CONTEXT *src_ctx) {
  dst_ctx->mic = src_ctx->mic;
  dst_ctx->mbmi_ext_best = src_ctx->mbmi_ext_best;

  dst_ctx->num_4x4_blk = src_ctx->num_4x4_blk;
  dst_ctx->skippable = src_ctx->skippable;
#if CONFIG_INTERNAL_STATS
  dst_ctx->best_mode_index = src_ctx->best_mode_index;
#endif  // CONFIG_INTERNAL_STATS

  memcpy(dst_ctx->blk_skip, src_ctx->blk_skip,
         sizeof(uint8_t) * src_ctx->num_4x4_blk);
  av1_copy_array(dst_ctx->tx_type_map, src_ctx->tx_type_map,
                 src_ctx->num_4x4_blk);

  dst_ctx->rd_stats = src_ctx->rd_stats;
  dst_ctx->rd_mode_is_ready = src_ctx->rd_mode_is_ready;
}